

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsEllipseItem::paint
          (QGraphicsEllipseItem *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  uint uVar1;
  QGraphicsItemPrivate *pQVar2;
  uint uVar3;
  
  pQVar2 = (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem.d_ptr.d;
  QPainter::setPen((QPen *)painter);
  QPainter::setBrush((QBrush *)painter);
  uVar1 = *(uint *)((long)&pQVar2[1].needsRepaint.w + 4);
  if (uVar1 != 0) {
    uVar3 = -uVar1;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    if (uVar3 % 0x1680 == 0) {
      QPainter::drawEllipse((QRectF *)painter);
      goto LAB_0057c76f;
    }
  }
  QPainter::drawPie((QRectF *)painter,(int)pQVar2 + 0x1a8,*(int *)&pQVar2[1].needsRepaint.w);
LAB_0057c76f:
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x8000) == 0) {
    return;
  }
  qt_graphicsItem_highlightSelected((QGraphicsItem *)this,painter,option);
  return;
}

Assistant:

void QGraphicsEllipseItem::paint(QPainter *painter, const QStyleOptionGraphicsItem *option,
                                 QWidget *widget)
{
    Q_D(QGraphicsEllipseItem);
    Q_UNUSED(widget);
    painter->setPen(d->pen);
    painter->setBrush(d->brush);
    if ((d->spanAngle != 0) && (qAbs(d->spanAngle) % (360 * 16) == 0))
        painter->drawEllipse(d->rect);
    else
        painter->drawPie(d->rect, d->startAngle, d->spanAngle);

    if (option->state & QStyle::State_Selected)
        qt_graphicsItem_highlightSelected(this, painter, option);
}